

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O2

CborError create_container(CborEncoder *encoder,CborEncoder *container,size_t length,
                          uint8_t shiftedMajorType)

{
  CborError CVar1;
  
  container->data = encoder->data;
  container->end = encoder->end;
  encoder->added = encoder->added + 1;
  container->added = 0;
  container->flags = shiftedMajorType & 0x20;
  if (length != 0xffffffffffffffff) {
    CVar1 = encode_number_no_update(container,length,shiftedMajorType);
    return CVar1;
  }
  container->flags = shiftedMajorType & 0x20 | 4;
  CVar1 = append_byte_to_buffer(container,shiftedMajorType + '\x1f');
  return CVar1;
}

Assistant:

__attribute__((noinline))
#endif
static CborError create_container(CborEncoder *encoder, CborEncoder *container, size_t length, uint8_t shiftedMajorType)
{
    CborError err;
    container->data.ptr = encoder->data.ptr;
    container->end = encoder->end;
    ++encoder->added;
    container->added = 0;

    cbor_static_assert(((MapType << MajorTypeShift) & CborIteratorFlag_ContainerIsMap) == CborIteratorFlag_ContainerIsMap);
    cbor_static_assert(((ArrayType << MajorTypeShift) & CborIteratorFlag_ContainerIsMap) == 0);
    container->flags = shiftedMajorType & CborIteratorFlag_ContainerIsMap;

    if (length == CborIndefiniteLength) {
        container->flags |= CborIteratorFlag_UnknownLength;
        err = append_byte_to_buffer(container, shiftedMajorType + IndefiniteLength);
    } else {
        err = encode_number_no_update(container, length, shiftedMajorType);
    }
    return err;
}